

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterproperties.cpp
# Opt level: O0

void icu_63::CharacterProperties::initInclusion(UPropertySource src,UErrorCode *errorCode)

{
  UBool UVar1;
  long *plVar2;
  UnicodeSet *pUVar3;
  Normalizer2Impl *pNVar4;
  USetAdder *sa_00;
  UnicodeSet *local_a0;
  Normalizer2Impl *impl_4;
  Normalizer2Impl *impl_3;
  Normalizer2Impl *impl_2;
  Normalizer2Impl *impl_1;
  Normalizer2Impl *impl;
  USetAdder sa;
  UnicodeSet **incl;
  UErrorCode *errorCode_local;
  UPropertySource src_local;
  
  if (src == UPROPS_SRC_NONE) {
    *errorCode = U_INTERNAL_PROGRAM_ERROR;
  }
  else {
    plVar2 = &(anonymous_namespace)::gInclusions + (ulong)src * 2;
    pUVar3 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)errorCode);
    local_a0 = (UnicodeSet *)0x0;
    if (pUVar3 != (UnicodeSet *)0x0) {
      UnicodeSet::UnicodeSet(pUVar3);
      local_a0 = pUVar3;
    }
    *plVar2 = (long)local_a0;
    if (*plVar2 == 0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      impl = (Normalizer2Impl *)*plVar2;
      sa.set = (USet *)anon_unknown.dwarf_10348e::_set_add;
      sa.add = anon_unknown.dwarf_10348e::_set_addRange;
      sa.addRange = anon_unknown.dwarf_10348e::_set_addString;
      sa.addString = (USetAddString *)0x0;
      sa.remove = (undefined1 *)0x0;
      sa_00 = (USetAdder *)0xc00;
      UnicodeSet::ensureCapacity((UnicodeSet *)*plVar2,0xc00,errorCode);
      switch(src) {
      case UPROPS_SRC_CHAR:
        sa_00 = (USetAdder *)errorCode;
        uchar_addPropertyStarts_63((USetAdder *)&impl,errorCode);
        break;
      case UPROPS_SRC_PROPSVEC:
        sa_00 = (USetAdder *)errorCode;
        upropsvec_addPropertyStarts_63((USetAdder *)&impl,errorCode);
        break;
      default:
        *errorCode = U_INTERNAL_PROGRAM_ERROR;
        break;
      case UPROPS_SRC_CASE:
        sa_00 = (USetAdder *)errorCode;
        ucase_addPropertyStarts_63((USetAdder *)&impl,errorCode);
        break;
      case UPROPS_SRC_BIDI:
        sa_00 = (USetAdder *)errorCode;
        ubidi_addPropertyStarts_63((USetAdder *)&impl,errorCode);
        break;
      case UPROPS_SRC_CHAR_AND_PROPSVEC:
        uchar_addPropertyStarts_63((USetAdder *)&impl,errorCode);
        sa_00 = (USetAdder *)errorCode;
        upropsvec_addPropertyStarts_63((USetAdder *)&impl,errorCode);
        break;
      case UPROPS_SRC_CASE_AND_NORM:
        pNVar4 = Normalizer2Factory::getNFCImpl(errorCode);
        UVar1 = ::U_SUCCESS(*errorCode);
        if (UVar1 != '\0') {
          Normalizer2Impl::addPropertyStarts(pNVar4,(USetAdder *)&impl,errorCode);
        }
        sa_00 = (USetAdder *)errorCode;
        ucase_addPropertyStarts_63((USetAdder *)&impl,errorCode);
        break;
      case UPROPS_SRC_NFC:
        pNVar4 = Normalizer2Factory::getNFCImpl(errorCode);
        UVar1 = ::U_SUCCESS(*errorCode);
        if (UVar1 != '\0') {
          sa_00 = (USetAdder *)&impl;
          Normalizer2Impl::addPropertyStarts(pNVar4,sa_00,errorCode);
        }
        break;
      case UPROPS_SRC_NFKC:
        pNVar4 = Normalizer2Factory::getNFKCImpl(errorCode);
        UVar1 = ::U_SUCCESS(*errorCode);
        if (UVar1 != '\0') {
          sa_00 = (USetAdder *)&impl;
          Normalizer2Impl::addPropertyStarts(pNVar4,sa_00,errorCode);
        }
        break;
      case UPROPS_SRC_NFKC_CF:
        pNVar4 = Normalizer2Factory::getNFKC_CFImpl(errorCode);
        UVar1 = ::U_SUCCESS(*errorCode);
        if (UVar1 != '\0') {
          sa_00 = (USetAdder *)&impl;
          Normalizer2Impl::addPropertyStarts(pNVar4,sa_00,errorCode);
        }
        break;
      case UPROPS_SRC_NFC_CANON_ITER:
        pNVar4 = Normalizer2Factory::getNFCImpl(errorCode);
        UVar1 = ::U_SUCCESS(*errorCode);
        if (UVar1 != '\0') {
          sa_00 = (USetAdder *)&impl;
          Normalizer2Impl::addCanonIterPropertyStarts(pNVar4,sa_00,errorCode);
        }
        break;
      case UPROPS_SRC_INPC:
      case UPROPS_SRC_INSC:
      case UPROPS_SRC_VO:
        sa_00 = (USetAdder *)&impl;
        uprops_addPropertyStarts_63(src,sa_00,errorCode);
      }
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 == '\0') {
        UnicodeSet::compact((UnicodeSet *)*plVar2);
        ucln_common_registerCleanup_63
                  (UCLN_COMMON_CHARACTERPROPERTIES,
                   anon_unknown.dwarf_10348e::characterproperties_cleanup);
      }
      else {
        pUVar3 = (UnicodeSet *)*plVar2;
        if (pUVar3 != (UnicodeSet *)0x0) {
          UnicodeSet::~UnicodeSet(pUVar3);
          UMemory::operator_delete((UMemory *)pUVar3,sa_00);
        }
        *plVar2 = 0;
      }
    }
  }
  return;
}

Assistant:

void U_CALLCONV CharacterProperties::initInclusion(UPropertySource src, UErrorCode &errorCode) {
    // This function is invoked only via umtx_initOnce().
    // This function is a friend of class UnicodeSet.

    U_ASSERT(0 <= src && src < UPROPS_SRC_COUNT);
    if (src == UPROPS_SRC_NONE) {
        errorCode = U_INTERNAL_PROGRAM_ERROR;
        return;
    }
    UnicodeSet * &incl = gInclusions[src].fSet;
    U_ASSERT(incl == nullptr);

    incl = new UnicodeSet();
    if (incl == nullptr) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    USetAdder sa = {
        (USet *)incl,
        _set_add,
        _set_addRange,
        _set_addString,
        nullptr, // don't need remove()
        nullptr // don't need removeRange()
    };

    incl->ensureCapacity(DEFAULT_INCLUSION_CAPACITY, errorCode);
    switch(src) {
    case UPROPS_SRC_CHAR:
        uchar_addPropertyStarts(&sa, &errorCode);
        break;
    case UPROPS_SRC_PROPSVEC:
        upropsvec_addPropertyStarts(&sa, &errorCode);
        break;
    case UPROPS_SRC_CHAR_AND_PROPSVEC:
        uchar_addPropertyStarts(&sa, &errorCode);
        upropsvec_addPropertyStarts(&sa, &errorCode);
        break;
#if !UCONFIG_NO_NORMALIZATION
    case UPROPS_SRC_CASE_AND_NORM: {
        const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
        if(U_SUCCESS(errorCode)) {
            impl->addPropertyStarts(&sa, errorCode);
        }
        ucase_addPropertyStarts(&sa, &errorCode);
        break;
    }
    case UPROPS_SRC_NFC: {
        const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
        if(U_SUCCESS(errorCode)) {
            impl->addPropertyStarts(&sa, errorCode);
        }
        break;
    }
    case UPROPS_SRC_NFKC: {
        const Normalizer2Impl *impl=Normalizer2Factory::getNFKCImpl(errorCode);
        if(U_SUCCESS(errorCode)) {
            impl->addPropertyStarts(&sa, errorCode);
        }
        break;
    }
    case UPROPS_SRC_NFKC_CF: {
        const Normalizer2Impl *impl=Normalizer2Factory::getNFKC_CFImpl(errorCode);
        if(U_SUCCESS(errorCode)) {
            impl->addPropertyStarts(&sa, errorCode);
        }
        break;
    }
    case UPROPS_SRC_NFC_CANON_ITER: {
        const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
        if(U_SUCCESS(errorCode)) {
            impl->addCanonIterPropertyStarts(&sa, errorCode);
        }
        break;
    }
#endif
    case UPROPS_SRC_CASE:
        ucase_addPropertyStarts(&sa, &errorCode);
        break;
    case UPROPS_SRC_BIDI:
        ubidi_addPropertyStarts(&sa, &errorCode);
        break;
    case UPROPS_SRC_INPC:
    case UPROPS_SRC_INSC:
    case UPROPS_SRC_VO:
        uprops_addPropertyStarts((UPropertySource)src, &sa, &errorCode);
        break;
    default:
        errorCode = U_INTERNAL_PROGRAM_ERROR;
        break;
    }

    if (U_FAILURE(errorCode)) {
        delete incl;
        incl = nullptr;
        return;
    }
    // Compact for caching
    incl->compact();
    ucln_common_registerCleanup(UCLN_COMMON_CHARACTERPROPERTIES, characterproperties_cleanup);
}